

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O3

bool __thiscall DPlayerMenu::MouseEvent(DPlayerMenu *this,int type,int x,int y)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined8 *puVar4;
  uint uVar5;
  uint green;
  uint red;
  FListMenuItem *pFVar6;
  int v;
  FName current;
  undefined8 local_28;
  
  pFVar6 = (this->super_DListMenu).mFocusControl;
  local_28 = in_RAX;
  bVar2 = DListMenu::MouseEvent(&this->super_DListMenu,type,x,y);
  if (pFVar6 == (FListMenuItem *)0x0) {
    pFVar6 = (this->super_DListMenu).mFocusControl;
  }
  if (pFVar6 == (FListMenuItem *)0x0) {
    return bVar2;
  }
  (*pFVar6->_vptr_FListMenuItem[7])((long)&local_28 + 4,pFVar6,0);
  if (local_28._4_4_ == 0x1e9) {
    iVar3 = (*pFVar6->_vptr_FListMenuItem[0xb])(pFVar6,0,&local_28);
    if ((char)iVar3 == '\0') {
      return bVar2;
    }
    puVar1 = (undefined8 *)
             ((ulong)(((&DAT_00a602d8)[(long)consoleplayer * 0xa8] - 1 & 0x1e6) * 0x18) +
             (&DAT_00a602c8)[(long)consoleplayer * 0x54]);
    do {
      puVar4 = puVar1;
      puVar1 = (undefined8 *)*puVar4;
    } while (*(int *)(puVar4 + 1) != 0x1e6);
    red = *(uint *)(puVar4[2] + 0x28) >> 0x10 & 0xff;
    green = *(uint *)(puVar4[2] + 0x28) >> 8 & 0xff;
  }
  else {
    if (local_28._4_4_ == 0x1e8) {
      iVar3 = (*pFVar6->_vptr_FListMenuItem[0xb])(pFVar6,0,&local_28);
      if ((char)iVar3 == '\0') {
        return bVar2;
      }
      puVar1 = (undefined8 *)
               ((ulong)(((&DAT_00a602d8)[(long)consoleplayer * 0xa8] - 1 & 0x1e6) * 0x18) +
               (&DAT_00a602c8)[(long)consoleplayer * 0x54]);
      do {
        puVar4 = puVar1;
        puVar1 = (undefined8 *)*puVar4;
      } while (*(int *)(puVar4 + 1) != 0x1e6);
      uVar5 = *(uint *)(puVar4[2] + 0x28);
      red = uVar5 >> 0x10 & 0xff;
    }
    else {
      if (local_28._4_4_ != 0x1e7) {
        return bVar2;
      }
      iVar3 = (*pFVar6->_vptr_FListMenuItem[0xb])(pFVar6,0,&local_28);
      if ((char)iVar3 == '\0') {
        return bVar2;
      }
      puVar1 = (undefined8 *)
               ((ulong)(((&DAT_00a602d8)[(long)consoleplayer * 0xa8] - 1 & 0x1e6) * 0x18) +
               (&DAT_00a602c8)[(long)consoleplayer * 0x54]);
      do {
        puVar4 = puVar1;
        puVar1 = (undefined8 *)*puVar4;
      } while (*(int *)(puVar4 + 1) != 0x1e6);
      uVar5 = *(uint *)(puVar4[2] + 0x28);
      red = (uint)local_28;
      local_28._0_4_ = uVar5 >> 8 & 0xff;
    }
    green = (uint)local_28;
    local_28._0_4_ = uVar5 & 0xff;
  }
  SendNewColor(this,red,green,(uint)local_28);
  return bVar2;
}

Assistant:

bool DPlayerMenu::MouseEvent(int type, int x, int y)
{
	int v;
	FListMenuItem *li = mFocusControl;
	bool res = Super::MouseEvent(type, x, y);
	if (li == NULL) li = mFocusControl;
	if (li != NULL)
	{
		// Check if the colors have changed
		FName current = li->GetAction(NULL);
		switch(current)
		{
		case NAME_Red:
			if (li->GetValue(0, &v))
			{
				uint32 color = players[consoleplayer].userinfo.GetColor();
				SendNewColor (v, GPART(color), BPART(color));
			}
			break;

		case NAME_Green:
			if (li->GetValue(0, &v))
			{
				uint32 color = players[consoleplayer].userinfo.GetColor();
				SendNewColor (RPART(color), v, BPART(color));
			}
			break;

		case NAME_Blue:
			if (li->GetValue(0, &v))
			{
				uint32 color = players[consoleplayer].userinfo.GetColor();
				SendNewColor (RPART(color), GPART(color), v);
			}
			break;
		}
	}
	return res;
}